

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O2

string * __thiscall ftxui::Screen::ToString_abi_cxx11_(string *__return_storage_ptr__,Screen *this)

{
  pointer pvVar1;
  pointer pPVar2;
  int iVar3;
  Pixel *this_00;
  long lVar4;
  Pixel *pixel;
  Pixel *next;
  bool bVar5;
  Pixel default_pixel;
  stringstream ss;
  undefined1 local_1e8 [48];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  this_00 = (Pixel *)local_1e8;
  Pixel::Pixel(this_00);
  for (lVar4 = 0; lVar4 < this->dimy_; lVar4 = lVar4 + 1) {
    if (lVar4 != 0) {
      anon_unknown_0::UpdatePixelStyle(this,(stringstream *)local_1b8,this_00,(Pixel *)local_1e8);
      std::operator<<(local_1a8,"\r\n");
      this_00 = (Pixel *)local_1e8;
    }
    pvVar1 = (this->pixels_).
             super__Vector_base<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar2 = *(pointer *)
              ((long)&pvVar1[lVar4].super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>.
                      _M_impl.super__Vector_impl_data + 8);
    bVar5 = false;
    for (next = pvVar1[lVar4].super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>.
                _M_impl.super__Vector_impl_data._M_start; next != pPVar2; next = next + 1) {
      if (!bVar5) {
        anon_unknown_0::UpdatePixelStyle(this,(stringstream *)local_1b8,this_00,next);
        std::operator<<(local_1a8,(string *)&next->character);
        this_00 = next;
      }
      iVar3 = string_width(&next->character);
      bVar5 = iVar3 == 2;
    }
  }
  anon_unknown_0::UpdatePixelStyle(this,(stringstream *)local_1b8,this_00,(Pixel *)local_1e8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string Screen::ToString() const {
  std::stringstream ss;

  const Pixel default_pixel;
  const Pixel* previous_pixel_ref = &default_pixel;

  for (int y = 0; y < dimy_; ++y) {
    // New line in between two lines.
    if (y != 0) {
      UpdatePixelStyle(this, ss, *previous_pixel_ref, default_pixel);
      previous_pixel_ref = &default_pixel;
      ss << "\r\n";
    }

    // After printing a fullwith character, we need to skip the next cell.
    bool previous_fullwidth = false;
    for (const auto& pixel : pixels_[y]) {
      if (!previous_fullwidth) {
        UpdatePixelStyle(this, ss, *previous_pixel_ref, pixel);
        previous_pixel_ref = &pixel;
        ss << pixel.character;
      }
      previous_fullwidth = (string_width(pixel.character) == 2);
    }
  }

  // Reset the style to default:
  UpdatePixelStyle(this, ss, *previous_pixel_ref, default_pixel);

  return ss.str();
}